

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

void Curl_expire(Curl_easy *data,time_t milli,expire_id id)

{
  Curl_multi *pCVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  curltime *pcVar6;
  timediff_t tVar7;
  Curl_tree *pCVar8;
  curltime i;
  curltime older;
  curltime cVar9;
  timediff_t diff;
  undefined4 uStack_4c;
  undefined1 local_48 [8];
  curltime set;
  int rc;
  curltime *nowp;
  Curl_multi *multi;
  expire_id id_local;
  time_t milli_local;
  Curl_easy *data_local;
  
  pCVar1 = data->multi;
  pcVar6 = &(data->state).expiretime;
  if (pCVar1 != (Curl_multi *)0x0) {
    cVar9 = Curl_now();
    set.tv_sec._4_4_ = uStack_4c;
    local_48 = (undefined1  [8])(milli / 1000 + cVar9.tv_sec);
    set.tv_sec._0_4_ = (int)(milli % 1000) * 1000 + cVar9.tv_usec;
    if (999999 < (int)set.tv_sec) {
      local_48 = (undefined1  [8])((long)local_48 + 1);
      set.tv_sec._0_4_ = (int)set.tv_sec + -1000000;
    }
    multi_deltimeout(data,id);
    multi_addtimeout(data,(curltime *)local_48,id);
    if ((pcVar6->tv_sec != 0) || ((data->state).expiretime.tv_usec != 0)) {
      cVar9.tv_usec = (int)set.tv_sec;
      cVar9.tv_sec = (time_t)local_48;
      uVar2 = pcVar6->tv_sec;
      uVar3 = pcVar6->tv_usec;
      older.tv_usec = uVar3;
      older.tv_sec = uVar2;
      cVar9._12_4_ = 0;
      older._12_4_ = 0;
      tVar7 = Curl_timediff(cVar9,older);
      if (0 < tVar7) {
        return;
      }
      set._12_4_ = Curl_splayremovebyaddr
                             (pCVar1->timetree,&(data->state).timenode,&pCVar1->timetree);
      if (set._12_4_ != 0) {
        Curl_infof(data,"Internal error removing splay node = %d\n",(ulong)(uint)set._12_4_);
      }
    }
    pcVar6->tv_sec = (time_t)local_48;
    *(ulong *)&(data->state).expiretime.tv_usec = CONCAT44(set.tv_sec._4_4_,(int)set.tv_sec);
    (data->state).timenode.payload = data;
    uVar4 = pcVar6->tv_sec;
    uVar5 = pcVar6->tv_usec;
    i.tv_usec = uVar5;
    i.tv_sec = uVar4;
    i._12_4_ = 0;
    pCVar8 = Curl_splayinsert(i,pCVar1->timetree,&(data->state).timenode);
    pCVar1->timetree = pCVar8;
  }
  return;
}

Assistant:

void Curl_expire(struct Curl_easy *data, time_t milli, expire_id id)
{
  struct Curl_multi *multi = data->multi;
  struct curltime *nowp = &data->state.expiretime;
  int rc;
  struct curltime set;

  /* this is only interesting while there is still an associated multi struct
     remaining! */
  if(!multi)
    return;

  DEBUGASSERT(id < EXPIRE_LAST);

  set = Curl_now();
  set.tv_sec += milli/1000;
  set.tv_usec += (unsigned int)(milli%1000)*1000;

  if(set.tv_usec >= 1000000) {
    set.tv_sec++;
    set.tv_usec -= 1000000;
  }

  /* Remove any timer with the same id just in case. */
  multi_deltimeout(data, id);

  /* Add it to the timer list.  It must stay in the list until it has expired
     in case we need to recompute the minimum timer later. */
  multi_addtimeout(data, &set, id);

  if(nowp->tv_sec || nowp->tv_usec) {
    /* This means that the struct is added as a node in the splay tree.
       Compare if the new time is earlier, and only remove-old/add-new if it
       is. */
    timediff_t diff = Curl_timediff(set, *nowp);

    if(diff > 0) {
      /* The current splay tree entry is sooner than this new expiry time.
         We don't need to update our splay tree entry. */
      return;
    }

    /* Since this is an updated time, we must remove the previous entry from
       the splay tree first and then re-add the new value */
    rc = Curl_splayremovebyaddr(multi->timetree,
                                &data->state.timenode,
                                &multi->timetree);
    if(rc)
      infof(data, "Internal error removing splay node = %d\n", rc);
  }

  /* Indicate that we are in the splay tree and insert the new timer expiry
     value since it is our local minimum. */
  *nowp = set;
  data->state.timenode.payload = data;
  multi->timetree = Curl_splayinsert(*nowp, multi->timetree,
                                     &data->state.timenode);
}